

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O0

ans_reorder_fold_encode<2U> * ans_reorder_fold_encode<2U>::create(uint32_t *in_u32,size_t n)

{
  uint uVar1;
  int iVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  ulong uVar3;
  value_type vVar4;
  int iVar5;
  uint32_t uVar6;
  uint *puVar7;
  reference pvVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  size_type sVar12;
  reference pvVar13;
  ulong in_RDX;
  long in_RSI;
  ans_reorder_fold_encode<2U> *in_RDI;
  size_t sym;
  uint64_t tmp;
  uint64_t cur_base;
  uint32_t mapped_u32;
  size_t i_6;
  uint32_t max_sym;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  uint32_t MAX_SIGMA;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t no_except_thres;
  size_t i_2;
  size_t i_1;
  vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
  unmapped_freqs;
  size_t i;
  uint32_t unmapped_max_sym;
  ans_reorder_fold_encode<2U> *model;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe50;
  uint16_t in_stack_fffffffffffffe52;
  uint32_t in_stack_fffffffffffffe54;
  __normal_iterator<std::pair<long,_unsigned_int>_*,_std::vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>_>
  in_stack_fffffffffffffe58;
  long lVar14;
  __normal_iterator<std::pair<long,_unsigned_int>_*,_std::vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>_>
  in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
  *in_stack_fffffffffffffe70;
  vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_> *this;
  size_type local_118;
  long local_110;
  vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_> local_f0;
  uint32_t local_d4;
  ulong local_d0;
  uint local_c8 [2];
  undefined8 local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  undefined4 local_9c;
  size_type local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  pair<long,_unsigned_int> *local_70;
  pair<long,_unsigned_int> *local_68;
  ulong local_60;
  uint32_t in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffc3;
  uint32_t in_stack_ffffffffffffffc4;
  pointer in_stack_ffffffffffffffc8;
  ulong local_28;
  uint local_20;
  byte local_19;
  ulong local_18;
  long local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ans_reorder_fold_encode
            ((ans_reorder_fold_encode<2U> *)
             CONCAT44(in_stack_fffffffffffffe54,
                      CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
  local_20 = 0;
  for (local_28 = 0; local_28 < local_18; local_28 = local_28 + 1) {
    puVar7 = std::max<unsigned_int>((uint *)(local_10 + local_28 * 4),&local_20);
    local_20 = *puVar7;
  }
  std::allocator<std::pair<long,_unsigned_int>_>::allocator
            ((allocator<std::pair<long,_unsigned_int>_> *)0x1e5cb1);
  std::vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>::
  vector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
         (allocator_type *)in_stack_fffffffffffffe60._M_current);
  std::allocator<std::pair<long,_unsigned_int>_>::~allocator
            ((allocator<std::pair<long,_unsigned_int>_> *)0x1e5cdd);
  for (local_60 = 0; local_60 < local_18; local_60 = local_60 + 1) {
    pvVar8 = std::
             vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
             ::operator[]((vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                           *)&stack0xffffffffffffffc0,(ulong)*(uint *)(local_10 + local_60 * 4));
    pvVar8->first = pvVar8->first + -1;
    uVar1 = *(uint *)(local_10 + local_60 * 4);
    pvVar8 = std::
             vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
             ::operator[]((vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                           *)&stack0xffffffffffffffc0,(ulong)*(uint *)(local_10 + local_60 * 4));
    pvVar8->second = uVar1;
  }
  local_68 = (pair<long,_unsigned_int> *)
             std::
             vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
             ::begin((vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                      *)in_stack_fffffffffffffe48._M_current);
  local_70 = (pair<long,_unsigned_int> *)
             std::
             vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
             ::end((vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                    *)in_stack_fffffffffffffe48._M_current);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<long,unsigned_int>*,std::vector<std::pair<long,unsigned_int>,std::allocator<std::pair<long,unsigned_int>>>>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  in_RDI->sigma = 0;
  local_78 = 0;
  while ((uVar3 = local_78,
         sVar9 = std::
                 vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                 ::size((vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                         *)&stack0xffffffffffffffc0), uVar3 < sVar9 &&
         (pvVar8 = std::
                   vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                                 *)&stack0xffffffffffffffc0,local_78), pvVar8->first != 0))) {
    in_RDI->sigma = in_RDI->sigma + 1;
    local_78 = local_78 + 1;
  }
  local_80 = 0x200;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68);
  if (in_RDI->sigma < local_80) {
    for (local_88 = 0; local_88 < local_20 + 1; local_88 = local_88 + 1) {
      vVar4 = (value_type)local_88;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&in_RDI->mapping,local_88);
      *pvVar10 = vVar4;
    }
  }
  else {
    for (local_90 = 0; local_90 <= local_20; local_90 = local_90 + 1) {
      iVar5 = (int)local_90;
      iVar2 = (int)local_80;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&in_RDI->mapping,local_90);
      *pvVar10 = iVar5 + iVar2;
    }
    for (local_98 = 0; local_98 < local_80; local_98 = local_98 + 1) {
      vVar4 = (value_type)local_98;
      pvVar8 = std::
               vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
               ::operator[]((vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                             *)&stack0xffffffffffffffc0,local_98);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&in_RDI->mapping,(ulong)pvVar8->second);
      *pvVar10 = vVar4;
      std::vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>::
      operator[]((vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                  *)&stack0xffffffffffffffc0,local_98);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffffe60._M_current,
                 (value_type *)in_stack_fffffffffffffe58._M_current);
    }
  }
  local_9c = 0x800;
  local_c0 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1e608e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68,(value_type_conflict2 *)in_stack_fffffffffffffe60._M_current,
             (allocator_type *)in_stack_fffffffffffffe58._M_current);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1e60bc);
  local_c8[0] = 0;
  for (local_d0 = 0; local_d0 < local_18; local_d0 = local_d0 + 1) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&in_RDI->mapping,(ulong)*(uint *)(local_10 + local_d0 * 4));
    local_d4 = ans_reorder_fold_mapping<2u>(*pvVar10);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&local_b8,(ulong)local_d4);
    *pvVar11 = *pvVar11 + 1;
    puVar7 = std::max<unsigned_int>(&local_d4,local_c8);
    local_c8[0] = *puVar7;
  }
  adjust_freqs((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc4,(bool)in_stack_ffffffffffffffc3,in_stack_ffffffffffffffbc);
  this = &local_f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe60._M_current,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe58._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe60._M_current);
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe48._M_current);
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe48._M_current);
  __first._M_current._2_2_ = in_stack_fffffffffffffe52;
  __first._M_current._0_2_ = in_stack_fffffffffffffe50;
  __first._M_current._4_4_ = in_stack_fffffffffffffe54;
  iVar5 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (__first,in_stack_fffffffffffffe48,0);
  in_RDI->frame_size = (long)iVar5;
  uVar6 = 0;
  local_110 = 0x1000000000;
  std::vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>::resize
            (this,in_stack_fffffffffffffe68);
  local_118 = 0;
  while (sVar9 = local_118,
        sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->nfreqs),
        sVar9 < sVar12) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&in_RDI->nfreqs,local_118);
    in_stack_fffffffffffffe52 = (uint16_t)*pvVar10;
    pvVar13 = std::vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>::
              operator[](&in_RDI->table,local_118);
    pvVar13->freq = in_stack_fffffffffffffe52;
    in_stack_fffffffffffffe54 = uVar6;
    pvVar13 = std::vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>::
              operator[](&in_RDI->table,local_118);
    pvVar13->base = in_stack_fffffffffffffe54;
    lVar14 = local_110;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&in_RDI->nfreqs,local_118);
    in_stack_fffffffffffffe60._M_current = (pair<long,_unsigned_int> *)(lVar14 * (ulong)*pvVar10);
    pvVar13 = std::vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>::
              operator[](&in_RDI->table,local_118);
    pvVar13->sym_upper_bound = (uint64_t)in_stack_fffffffffffffe60._M_current;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&in_RDI->nfreqs,local_118);
    uVar6 = *pvVar10 + uVar6;
    local_118 = local_118 + 1;
  }
  in_RDI->lower_bound = in_RDI->frame_size << 4;
  local_19 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe60._M_current);
  std::vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>::
  ~vector((vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_> *)
          in_stack_fffffffffffffe60._M_current);
  if ((local_19 & 1) == 0) {
    ~ans_reorder_fold_encode
              ((ans_reorder_fold_encode<2U> *)
               CONCAT44(in_stack_fffffffffffffe54,
                        CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
  }
  return in_RDI;
}

Assistant:

static ans_reorder_fold_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_reorder_fold_encode model;

        // 1) identify most frequent syms
        uint32_t unmapped_max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            unmapped_max_sym = std::max(in_u32[i], unmapped_max_sym);
        }
        std::vector<std::pair<int64_t, uint32_t>> unmapped_freqs(
            unmapped_max_sym + 1);
        for (size_t i = 0; i < n; i++) {
            unmapped_freqs[in_u32[i]].first--;
            unmapped_freqs[in_u32[i]].second = in_u32[i];
        }
        std::sort(unmapped_freqs.begin(), unmapped_freqs.end());
        model.sigma = 0;
        for (size_t i = 0; i < unmapped_freqs.size(); i++) {
            if (unmapped_freqs[i].first == 0)
                break;
            model.sigma++;
        }
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        model.mapping.resize(unmapped_max_sym + 1);
        if (model.sigma < no_except_thres) {
            for (size_t i = 0; i < unmapped_max_sym + 1; i++) {
                model.mapping[i] = i;
            }
        } else {
            for (size_t i = 0; i <= unmapped_max_sym; i++) {
                model.mapping[i] = i + no_except_thres;
            }
            for (size_t i = 0; i < no_except_thres; i++) {
                model.mapping[unmapped_freqs[i].second] = i;
                model.most_frequent.push_back(unmapped_freqs[i].second);
            }
        }
        const uint32_t MAX_SIGMA = 1 << (fidelity + 8 + 1);
        std::vector<uint64_t> freqs(MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32
                = ans_reorder_fold_mapping<fidelity>(model.mapping[in_u32[i]]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }